

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O2

int eia608_to_utf8(uint16_t c,int *chan,char *str1,char *str2)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  
  *chan = 0;
  uVar4 = (uint)c;
  if ((c & 0x6000) == 0) {
    *chan = uVar4 & 0x800;
    uVar1 = uVar4 & 0x177f;
    if ((c & 6000) == 0x1130) {
      uVar1 = uVar1 - 0x10d0;
    }
    else if ((short)(uVar4 & 0x1760) == 0x1320) {
      uVar1 = uVar1 - 0x1290;
    }
    else {
      if ((uVar4 & 0x1760) != 0x1220) {
        pcVar3 = "";
        uVar4 = 0xffffffff;
        iVar2 = 0;
        goto LAB_00105398;
      }
      uVar1 = uVar1 - 0x11b0;
    }
LAB_00105374:
    iVar2 = 1;
    uVar4 = 0xffffffff;
  }
  else {
    uVar1 = (c >> 8 & 0x7f) - 0x20;
    if ((ushort)(uVar4 & 0x7f) < 0x20) goto LAB_00105374;
    uVar4 = (uVar4 & 0x7f) - 0x20;
    iVar2 = 2;
  }
  if (uVar1 < 0xb0) {
    pcVar3 = eia608_char_map[uVar1];
  }
  else {
    pcVar3 = "";
  }
LAB_00105398:
  utf8_char_copy(str1,pcVar3);
  if (uVar4 < 0xb0) {
    pcVar3 = eia608_char_map[uVar4];
  }
  else {
    pcVar3 = "";
  }
  utf8_char_copy(str2,pcVar3);
  return iVar2;
}

Assistant:

int eia608_to_utf8(uint16_t c, int* chan, char* str1, char* str2)
{
    int c1, c2;
    int size = (int)eia608_to_index(c, chan, &c1, &c2);
    utf8_char_copy(str1, utf8_from_index(c1));
    utf8_char_copy(str2, utf8_from_index(c2));
    return size;
}